

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmSinglePixelSwapHsv.cpp
# Opt level: O1

QString * __thiscall
AlgorithmSinglePixelSwapHsv::GetDescription
          (QString *__return_storage_ptr__,AlgorithmSinglePixelSwapHsv *this)

{
  QByteArrayView QVar1;
  Data *local_28;
  char16_t *local_20;
  qsizetype local_18;
  
  QVar1.m_data = (storage_type *)0x26d;
  QVar1.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar1);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = local_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

QString AlgorithmSinglePixelSwapHsv::GetDescription()
{
    return "<p>Randomly chooses two pixels, and swaps them if the total colour "
           "error would be less.</p>"
           "<p>First, the colour of each pixel is converted to the HSV "
           "colourspace, then the pixels are compared against the target image"
           "to calculate the error, i.e. the difference in HSV values between "
           "the rgb image and the target image.</p>"
           "<p>The error calculation can take advantage of the HSV colour "
           "representation and a quirk of human vision, we are more perceptive "
           "at luminosity (light/dark) differences than hue (colour) "
           "differences. Therefore when calculating error, luminosity error is "
           "considered more important than colour error</p>";
}